

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs *bs,ma_uint32 blockSize,ma_uint32 order)

{
  ma_dr_flac_cache_t mVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ma_bool32 mVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  ma_uint32 mVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  ma_uint8 riceParam;
  ma_uint8 unencodedBitsPerSample;
  ma_uint8 partitionOrder;
  ma_uint8 residualMethod;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  int local_50;
  int local_4c;
  ulong local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  mVar6 = ma_dr_flac__read_uint8(bs,2,&local_51);
  if (((local_51 < 2 && mVar6 != 0) && (mVar6 = ma_dr_flac__read_uint8(bs,4,&local_52), mVar6 != 0))
     && (local_52 < 9)) {
    local_3c = blockSize >> (local_52 & 0x1f);
    if (order <= local_3c && local_3c - order != 0) {
      local_4c = 1 << (local_52 & 0x1f);
      uVar10 = local_3c - order;
      do {
        local_48 = (ulong)uVar10;
        local_54 = 0;
        if ((local_51 & 1) == 0) {
          mVar6 = ma_dr_flac__read_uint8(bs,4,&local_54);
          if (mVar6 == 0) {
            return 0;
          }
          if (local_54 != 0xf) goto LAB_0018e107;
LAB_0018e730:
          local_53 = 0;
          mVar6 = ma_dr_flac__read_uint8(bs,5,&local_53);
          if (mVar6 == 0) {
            return 0;
          }
          mVar6 = ma_dr_flac__seek_bits(bs,(ulong)((int)local_48 * (uint)local_53));
          if (mVar6 == 0) {
            return 0;
          }
        }
        else {
          mVar6 = ma_dr_flac__read_uint8(bs,5,&local_54);
          if (mVar6 == 0) {
            return 0;
          }
          if (local_54 == 0x1f) goto LAB_0018e730;
LAB_0018e107:
          if (local_54 == 0xff) goto LAB_0018e730;
          if ((int)local_48 != 0) {
            local_38 = (ulong)(local_54 + 1);
            local_40 = 0x3f - local_54;
            uVar7 = bs->cache;
            mVar14 = bs->consumedBits;
            local_50 = 0;
            do {
              if (ma_dr_flac__gIsLZCNTSupported == 0) {
                if (uVar7 == 0) goto LAB_0018e1fc;
                if (uVar7 < 0x1000000000000000) {
                  bVar18 = uVar7 >> 0x20 == 0;
                  uVar15 = uVar7 << 0x20;
                  if (!bVar18) {
                    uVar15 = uVar7;
                  }
                  iVar16 = (uint)bVar18 * 0x20;
                  iVar9 = iVar16 + 0x10;
                  uVar5 = uVar15 << 0x10;
                  if (0xffffffffffff < uVar15) {
                    iVar9 = iVar16;
                    uVar5 = uVar15;
                  }
                  iVar16 = iVar9 + 8;
                  uVar15 = uVar5 << 8;
                  if (0xffffffffffffff < uVar5) {
                    iVar16 = iVar9;
                    uVar15 = uVar5;
                  }
                  iVar9 = iVar16 + 4;
                  uVar5 = uVar15 << 4;
                  if (0xfffffffffffffff < uVar15) {
                    iVar9 = iVar16;
                    uVar5 = uVar15;
                  }
                  iVar9 = iVar9 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar5 >> 0x3c) * 4);
                }
                else {
                  iVar9 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                  (uVar7 >> 0x3c) * 4);
                }
                uVar10 = iVar9 - 1;
              }
              else {
                uVar10 = (uint)LZCOUNT(uVar7);
              }
              while (0x3f < uVar10) {
LAB_0018e1fc:
                uVar10 = bs->nextL2Line;
                if ((ulong)uVar10 < 0x200) {
                  uVar12 = bs->crc16;
                  uVar13 = (uint)uVar12;
                  if (bs->crc16CacheIgnoredBytes < 8) {
                    mVar1 = bs->crc16Cache;
                    uVar8 = (uint)mVar1;
                    uVar2 = (ushort)(mVar1 >> 0x30);
                    uVar3 = (uint)(mVar1 >> 0x10);
                    uVar17 = (uint)(mVar1 >> 0x18);
                    uVar4 = (uint)(mVar1 >> 0x20);
                    switch(bs->crc16CacheIgnoredBytes) {
                    case 0:
                      bs->crc16 = ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar4 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar12 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar12 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar12 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar12 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           uVar17 & 0xff] << 8 ^ uVar8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar12 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar4 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar12 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar12 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar12 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) &
                                          0xff]) >> 8 & 0xff] << 8 ^
                                  ma_dr_flac__crc16_table
                                  [(((uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)uVar2 ^
                                                                      ((uint)uVar12 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(uVar12 >> 8) ^
                                                                             (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar4 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar12 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) &
                                            0xff] << 8 ^
                                    (uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [((uint)ma_dr_flac__crc16_table
                                                          [(uVar4 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar12 >> 8) ^
                                                                   (uint)(byte)(mVar1 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar12 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  << 8 ^ (uint)ma_dr_flac__crc16_table
                                                               [(uVar4 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar12 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar12 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff] << 8 ^ uVar8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar4 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar8) & 0xff];
                      break;
                    case 1:
                      uVar13 = (uint)(ushort)(uVar12 << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(ushort)(uVar2 ^ uVar12 >> 8) & 0xff]);
                    case 2:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar4 ^ uVar13) >> 8 & 0xff]);
                    case 3:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar4 ^ uVar13 >> 8) & 0xff]);
                    case 4:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table[uVar13 >> 8 ^ uVar17 & 0xff]);
                    case 5:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table
                                             [(ulong)(uVar13 >> 8 ^ uVar3 & 0xffff) & 0xff]);
                    case 6:
                      uVar12 = (ushort)(uVar13 << 8) ^
                               ma_dr_flac__crc16_table[(uVar8 ^ uVar13) >> 8 & 0xff];
                    case 7:
                      uVar12 = uVar12 << 8 ^ ma_dr_flac__crc16_table[(uVar8 ^ uVar12 >> 8) & 0xff];
                      goto LAB_0018e3d7;
                    }
                  }
                  else {
LAB_0018e3d7:
                    bs->crc16 = uVar12;
                    bs->crc16CacheIgnoredBytes = 0;
                  }
                  bs->nextL2Line = uVar10 + 1;
                  uVar7 = bs->cacheL2[uVar10];
                  uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                          (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                          (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                          (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                  bs->crc16Cache = uVar7;
                  mVar14 = 0;
                }
                else {
                  mVar6 = ma_dr_flac__reload_cache(bs);
                  if (mVar6 == 0) {
                    return 0;
                  }
                  uVar7 = bs->cache;
                  mVar14 = bs->consumedBits;
                }
                if (ma_dr_flac__gIsLZCNTSupported == 0) {
                  if (uVar7 == 0) {
                    uVar10 = 0x40;
                  }
                  else {
                    if (uVar7 < 0x1000000000000000) {
                      bVar18 = uVar7 >> 0x20 == 0;
                      uVar15 = uVar7 << 0x20;
                      if (!bVar18) {
                        uVar15 = uVar7;
                      }
                      iVar16 = (uint)bVar18 * 0x20;
                      iVar9 = iVar16 + 0x10;
                      uVar5 = uVar15 << 0x10;
                      if (0xffffffffffff < uVar15) {
                        iVar9 = iVar16;
                        uVar5 = uVar15;
                      }
                      iVar16 = iVar9 + 8;
                      uVar15 = uVar5 << 8;
                      if (0xffffffffffffff < uVar5) {
                        iVar16 = iVar9;
                        uVar15 = uVar5;
                      }
                      iVar9 = iVar16 + 4;
                      uVar5 = uVar15 << 4;
                      if (0xfffffffffffffff < uVar15) {
                        iVar9 = iVar16;
                        uVar5 = uVar15;
                      }
                      iVar9 = iVar9 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                               clz_table_4 + (uVar5 >> 0x3c) * 4);
                    }
                    else {
                      iVar9 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar7 >> 0x3c) * 4);
                    }
                    uVar10 = iVar9 - 1;
                  }
                }
                else {
                  uVar10 = (uint)LZCOUNT(uVar7);
                }
              }
              uVar13 = mVar14 + uVar10;
              uVar17 = uVar13 - local_40;
              if (uVar13 < local_40 || uVar17 == 0) {
                uVar7 = (uVar7 << ((byte)uVar10 & 0x3f)) << ((byte)local_38 & 0x3f);
                mVar14 = uVar13 + (int)local_38;
              }
              else {
                uVar10 = bs->nextL2Line;
                if ((ulong)uVar10 < 0x200) {
                  uVar12 = bs->crc16;
                  uVar13 = (uint)uVar12;
                  if (bs->crc16CacheIgnoredBytes < 8) {
                    mVar1 = bs->crc16Cache;
                    uVar11 = (uint)mVar1;
                    uVar2 = (ushort)(mVar1 >> 0x30);
                    uVar4 = (uint)(mVar1 >> 0x10);
                    uVar3 = (uint)(mVar1 >> 0x18);
                    uVar8 = (uint)(mVar1 >> 0x20);
                    switch(bs->crc16CacheIgnoredBytes) {
                    case 0:
                      bs->crc16 = ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar8 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar12 >> 8) ^
                                                           (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar12 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar12 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar12 >> 8) ^
                                                                            (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                           uVar3 & 0xff] << 8 ^ uVar11 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar12 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar8 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar12 >> 8) ^
                                                                  (uint)(byte)(mVar1 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar12 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar12 >> 8) ^
                                                                          (uint)(byte)(mVar1 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar3 & 0xff]) >> 8 & 0xff ^ uVar4 & 0xffff) &
                                          0xff]) >> 8 & 0xff] << 8 ^
                                  ma_dr_flac__crc16_table
                                  [(((uint)ma_dr_flac__crc16_table
                                           [(((uint)ma_dr_flac__crc16_table
                                                    [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                     [((uint)uVar2 ^
                                                                      ((uint)uVar12 << 8 ^
                                                                      (uint)ma_dr_flac__crc16_table
                                                                            [(uint)(uVar12 >> 8) ^
                                                                             (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar8 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar12 >> 8) ^
                                                                    (uint)(byte)(mVar1 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar3 & 0xff]) >> 8 & 0xff ^ uVar4 & 0xffff) &
                                            0xff] << 8 ^
                                    (uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [((uint)ma_dr_flac__crc16_table
                                                          [(uVar8 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar12 >> 8) ^
                                                                   (uint)(byte)(mVar1 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar12 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar1 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  << 8 ^ (uint)ma_dr_flac__crc16_table
                                                               [(uVar8 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar12 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar12 >> 8) ^
                                                          (uint)(byte)(mVar1 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar3 & 0xff] << 8 ^ uVar11 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar8 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar1 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^ (uint)(byte)(mVar1 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar1 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar12 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar12 >> 8) ^
                                                                       (uint)(byte)(mVar1 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar3 & 0xff]) >> 8 & 0xff ^ uVar4 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar11) & 0xff]
                      ;
                      break;
                    case 1:
                      uVar13 = (uint)(ushort)(uVar12 << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(ushort)(uVar2 ^ uVar12 >> 8) & 0xff]);
                    case 2:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar8 ^ uVar13) >> 8 & 0xff]);
                    case 3:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar8 ^ uVar13 >> 8) & 0xff]);
                    case 4:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table[uVar13 >> 8 ^ uVar3 & 0xff]);
                    case 5:
                      uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                             ma_dr_flac__crc16_table
                                             [(ulong)(uVar13 >> 8 ^ uVar4 & 0xffff) & 0xff]);
                    case 6:
                      uVar12 = (ushort)(uVar13 << 8) ^
                               ma_dr_flac__crc16_table[(uVar11 ^ uVar13) >> 8 & 0xff];
                    case 7:
                      uVar12 = uVar12 << 8 ^ ma_dr_flac__crc16_table[(uVar11 ^ uVar12 >> 8) & 0xff];
                      goto LAB_0018e6dd;
                    }
                  }
                  else {
LAB_0018e6dd:
                    bs->crc16 = uVar12;
                    bs->crc16CacheIgnoredBytes = 0;
                  }
                  bs->nextL2Line = uVar10 + 1;
                  uVar7 = bs->cacheL2[uVar10];
                  uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                          (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                          (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                          (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                  bs->crc16Cache = uVar7;
                  mVar14 = uVar17;
                }
                else {
                  mVar6 = ma_dr_flac__reload_cache(bs);
                  if (mVar6 == 0) {
                    return 0;
                  }
                  if (0x40 - (ulong)bs->consumedBits < (ulong)uVar17) {
                    return 0;
                  }
                  uVar7 = bs->cache;
                  mVar14 = bs->consumedBits + uVar17;
                }
                uVar7 = uVar7 << ((byte)uVar17 & 0x3f);
              }
              bs->cache = uVar7;
              bs->consumedBits = mVar14;
              local_50 = local_50 + 1;
            } while (local_50 != (int)local_48);
          }
        }
        if (local_4c == 1) {
          return 1;
        }
        local_4c = local_4c + -1;
        uVar10 = local_3c;
      } while( true );
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs* bs, ma_uint32 blockSize, ma_uint32 order)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) <= order) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - order;
    partitionsRemaining = (1 << partitionOrder);
    for (;;)
    {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__read_and_seek_residual__rice(bs, samplesInPartition, riceParam)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__seek_bits(bs, unencodedBitsPerSample * samplesInPartition)) {
                return MA_FALSE;
            }
        }
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        samplesInPartition = blockSize / (1 << partitionOrder);
    }
    return MA_TRUE;
}